

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tnt_reply.c
# Opt level: O0

int tnt_reply_body0(tnt_reply *r,char *buf,size_t size,size_t *off)

{
  int iVar1;
  uint64_t uVar2;
  uint32_t local_9c;
  undefined4 local_98;
  uint32_t elen;
  uint32_t key;
  uint32_t n;
  uint64_t bitmap;
  char *sqlinfo_end;
  char *sqlinfo;
  char *metadata_end;
  char *metadata;
  char *data_end;
  char *data;
  char *error_end;
  char *error;
  char *p;
  char *test;
  size_t *off_local;
  size_t size_local;
  char *buf_local;
  tnt_reply *r_local;
  byte local_d;
  byte local_c;
  byte local_b;
  byte local_a;
  byte local_9;
  
  error = buf;
  p = buf;
  test = (char *)off;
  off_local = (size_t *)size;
  size_local = (size_t)buf;
  buf_local = (char *)r;
  iVar1 = mp_check(&p,buf + size);
  if (iVar1 == 0) {
    local_9 = *error;
    if (mp_type_hint[local_9] == MP_MAP) {
      error_end = (char *)0x0;
      data = (char *)0x0;
      data_end = (char *)0x0;
      metadata = (char *)0x0;
      metadata_end = (char *)0x0;
      sqlinfo = (char *)0x0;
      sqlinfo_end = (char *)0x0;
      bitmap = 0;
      _key = 0;
      elen = mp_decode_map(&error);
      while (elen != 0) {
        elen = elen - 1;
        uVar2 = mp_decode_uint(&error);
        local_98 = (undefined4)uVar2;
        switch(local_98) {
        case 0x30:
          local_b = *error;
          if (mp_type_hint[local_b] != MP_ARRAY) {
            return -1;
          }
          data_end = error;
          mp_next(&error);
          metadata = error;
          break;
        case 0x31:
          local_a = *error;
          if (mp_type_hint[local_a] != MP_STR) {
            return -1;
          }
          local_9c = 0;
          error_end = mp_decode_str(&error,&local_9c);
          data = error_end + local_9c;
          break;
        case 0x32:
          local_c = *error;
          if (mp_type_hint[local_c] != MP_ARRAY) {
            return -1;
          }
          metadata_end = error;
          mp_next(&error);
          sqlinfo = error;
          break;
        default:
          mp_next(&error);
          break;
        case 0x42:
          local_d = *error;
          if (mp_type_hint[local_d] != MP_MAP) {
            return -1;
          }
          sqlinfo_end = error;
          mp_next(&error);
          bitmap = (uint64_t)error;
        }
        _key = 1L << ((byte)local_98 & 0x3f) | _key;
      }
      if (buf_local != (char *)0x0) {
        *(char **)(buf_local + 0x38) = error_end;
        *(char **)(buf_local + 0x40) = data;
        *(char **)(buf_local + 0x48) = data_end;
        *(char **)(buf_local + 0x50) = metadata;
        *(char **)(buf_local + 0x58) = metadata_end;
        *(char **)(buf_local + 0x60) = sqlinfo;
        *(char **)(buf_local + 0x68) = sqlinfo_end;
        *(uint64_t *)(buf_local + 0x70) = bitmap;
        *(ulong *)(buf_local + 8) = _key | *(ulong *)(buf_local + 8);
      }
      if (test != (char *)0x0) {
        *(size_t *)test = (long)error - size_local;
      }
      r_local._4_4_ = 0;
    }
    else {
      r_local._4_4_ = -1;
    }
  }
  else {
    r_local._4_4_ = -1;
  }
  return r_local._4_4_;
}

Assistant:

int
tnt_reply_body0(struct tnt_reply *r, const char *buf, size_t size, size_t *off) {
	const char *test = buf;
	const char *p = buf;
	if (mp_check(&test, p + size))
		return -1;
	if (mp_typeof(*p) != MP_MAP)
		return -1;
	const char *error = NULL, *error_end = NULL,
		   *data = NULL, *data_end = NULL,
		   *metadata = NULL, *metadata_end = NULL,
		   *sqlinfo = NULL, *sqlinfo_end = NULL;
	uint64_t bitmap = 0;
	uint32_t n = mp_decode_map(&p);
	while (n-- > 0) {
		uint32_t key = mp_decode_uint(&p);
		switch (key) {
		case TNT_ERROR: {
			if (mp_typeof(*p) != MP_STR)
				return -1;
			uint32_t elen = 0;
			error = mp_decode_str(&p, &elen);
			error_end = error + elen;
			break;
		}
		case TNT_DATA: {
			if (mp_typeof(*p) != MP_ARRAY)
				return -1;
			data = p;
			mp_next(&p);
			data_end = p;
			break;
		}
		case TNT_METADATA: {
			if (mp_typeof(*p) != MP_ARRAY)
				return -1;
			metadata = p;
			mp_next(&p);
			metadata_end = p;
			break;
		}
		case TNT_SQL_INFO: {
			if (mp_typeof(*p) != MP_MAP)
				return -1;
			sqlinfo = p;
			mp_next(&p);
			sqlinfo_end = p;
			break;
		}
		default: {
			mp_next(&p);
			break;
		}
		}
		bitmap |= (1ULL << key);
	}
	if (r) {
		r->error = error;
		r->error_end = error_end;
		r->data = data;
		r->data_end = data_end;
		r->metadata = metadata;
		r->metadata_end = metadata_end;
		r->sqlinfo = sqlinfo;
		r->sqlinfo_end = sqlinfo_end;
		r->bitmap |= bitmap;
	}
	if (off)
		*off = p - buf;
	return 0;
}